

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Dropout::backward_impl
          (Dropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  int iVar25;
  int iVar26;
  Tensor m;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  ulong uStack_30;
  uint uStack_28;
  void *pvStack_20;
  undefined1 auStack_18 [16];
  pointer local_8;
  ulong uVar10;
  
  pvStack_20 = (this->super_Node).aux_mem;
  uStack_28 = (this->super_Node).dim.bd;
  uStack_30 = *(ulong *)((this->super_Node).dim.d + 6);
  local_48 = *(undefined8 *)(this->super_Node).dim.d;
  uStack_40 = *(undefined8 *)((this->super_Node).dim.d + 2);
  uStack_38 = *(undefined8 *)((this->super_Node).dim.d + 4);
  auStack_18 = (undefined1  [16])0x0;
  local_8 = (pointer)0x0;
  uVar10 = (ulong)(dEdf->d).nd;
  iVar26 = 1;
  iVar25 = 1;
  if (uVar10 != 0) {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar8 = (byte)uVar6;
      uVar16 = CONCAT11(bVar8,bVar7);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar12));
      auVar23._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar19._4_4_;
      auVar23._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar19._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar19._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar19._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar19._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar19._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar19._28_4_;
      auVar23._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
      auVar23._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
      auVar23._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
      auVar23._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
      auVar23._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
      auVar23._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
      auVar23._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
      auVar23._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
      auVar19 = vpmulld_avx512f(auVar23,auVar22);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar19 = vmovdqa32_avx512f(auVar19);
    auVar18._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._0_4_;
    bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar22._4_4_;
    bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar22._8_4_;
    bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar22._12_4_;
    bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar22._16_4_;
    bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar22._20_4_;
    bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar22._24_4_;
    bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar22._28_4_;
    auVar18._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar22._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar22._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar22._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar22._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar22._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar22._56_4_;
    auVar18._60_4_ =
         (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar18,1);
    auVar18 = vpmulld_avx512f(auVar18,ZEXT3264(auVar17));
    auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar25 = auVar4._0_4_;
  }
  uVar10 = uStack_30 >> 0x20;
  if (uVar10 != 0) {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar8 = (byte)uVar6;
      uVar16 = CONCAT11(bVar8,bVar7);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_48 + uVar12 * 4));
      auVar19._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar23._4_4_;
      auVar19._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar23._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar23._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar23._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar23._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar23._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar23._28_4_;
      auVar19._32_4_ = (uint)(bVar8 & 1) * auVar23._32_4_;
      auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar23._36_4_;
      auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar23._40_4_;
      auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar23._44_4_;
      auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar23._48_4_;
      auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar23._52_4_;
      auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar23._56_4_;
      auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar23._60_4_;
      auVar19 = vpmulld_avx512f(auVar19,auVar22);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar18 = vmovdqa32_avx512f(auVar19);
    auVar20._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._0_4_;
    bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar22._4_4_;
    bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar22._8_4_;
    bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar22._12_4_;
    bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar22._16_4_;
    bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar22._20_4_;
    bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar22._24_4_;
    bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar22._28_4_;
    auVar20._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar22._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar22._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar22._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar22._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar22._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar22._56_4_;
    auVar20._60_4_ =
         (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar20,1);
    auVar18 = vpmulld_avx512f(auVar20,ZEXT3264(auVar17));
    auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar26 = auVar4._0_4_;
  }
  uVar11 = iVar26 * uStack_28;
  if (iVar25 * (dEdf->d).bd != uVar11) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar10 = (ulong)(dEdxi->d).nd;
  if (uVar10 == 0) {
    iVar26 = 1;
  }
  else {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar19,auVar20);
      auVar19 = vporq_avx512f(auVar19,auVar21);
      uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar8 = (byte)uVar6;
      uVar16 = CONCAT11(bVar8,bVar7);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar12));
      auVar24._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar19._4_4_;
      auVar24._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar19._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar19._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar19._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar19._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar19._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar19._28_4_;
      auVar24._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
      auVar24._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
      auVar24._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
      auVar24._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
      auVar24._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
      auVar24._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
      auVar24._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
      auVar24._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
      auVar19 = vpmulld_avx512f(auVar24,auVar22);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar18 = vmovdqa32_avx512f(auVar19);
    auVar21._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._0_4_;
    bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar22._4_4_;
    bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar22._8_4_;
    bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar22._12_4_;
    bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar22._16_4_;
    bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar22._20_4_;
    bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar22._24_4_;
    bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar22._28_4_;
    auVar21._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar22._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar22._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar22._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar22._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar22._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar22._56_4_;
    auVar21._60_4_ =
         (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar21,1);
    auVar18 = vpmulld_avx512f(auVar21,ZEXT3264(auVar17));
    auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar26 = auVar4._0_4_;
  }
  uVar9 = iVar26 * (dEdxi->d).bd;
  uVar10 = (ulong)uVar9;
  if (uVar9 != uVar11) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar1 = dEdxi->v;
  uVar12 = uVar10;
  if ((((ulong)pfVar1 & 3) == 0) &&
     (uVar12 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar10 <= uVar12)) {
    uVar12 = uVar10;
  }
  pfVar2 = dEdf->v;
  uVar14 = uVar10 - uVar12;
  uVar13 = uVar14 + 0xf;
  if (-1 < (long)uVar14) {
    uVar13 = uVar14;
  }
  if (uVar12 != 0) {
    uVar15 = 0;
    do {
      auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvStack_20 + uVar15 * 4)),
                               ZEXT416((uint)pfVar2[uVar15]),ZEXT416((uint)pfVar1[uVar15]));
      pfVar1[uVar15] = auVar4._0_4_;
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  uVar13 = (uVar13 & 0xfffffffffffffff0) + uVar12;
  if (0xf < (long)uVar14) {
    do {
      auVar18 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pvStack_20 + uVar12 * 4),
                                    *(undefined1 (*) [64])(pfVar2 + uVar12),
                                    *(undefined1 (*) [64])(pfVar1 + uVar12));
      *(undefined1 (*) [64])(pfVar1 + uVar12) = auVar18;
      uVar12 = uVar12 + 0x10;
    } while ((long)uVar12 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar10) {
    do {
      auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvStack_20 + uVar13 * 4)),
                               ZEXT416((uint)pfVar2[uVar13]),ZEXT416((uint)pfVar1[uVar13]));
      pfVar1[uVar13] = auVar4._0_4_;
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)auStack_18);
  return;
}

Assistant:

void Dropout::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Pow not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  dEdxi.vec() += dEdf.vec().cwiseProduct(m.vec());
#endif
}